

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_scatter(Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv)

{
  char err_string [256];
  
  if (0 < nv) {
    if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
      sprintf(err_string,"%s: INVALID ARRAY HANDLE","nga_scatter");
      pnga_error(err_string,g_a);
    }
    if (GA[g_a + 1000].actv == 0) {
      sprintf(err_string,"%s: ARRAY NOT ACTIVE","nga_scatter");
      pnga_error(err_string,g_a);
    }
    GAstat.numsca = GAstat.numsca + 1;
    gai_gatscat_new(-99,g_a,v,subscript,c_flag,nv,&GAbytes.scatot,&GAbytes.scaloc,(void *)0x0);
  }
  return;
}

Assistant:

void pnga_scatter(Integer g_a, void* v, void *subscript, Integer c_flag, Integer nv)
{

  if (nv < 1) return;
  ga_check_handleM(g_a, "nga_scatter");
  
  GAstat.numsca++;

#ifdef USE_GATSCAT_NEW
  gai_gatscat_new(SCATTER,g_a,v,subscript,c_flag,nv,&GAbytes.scatot,&GAbytes.scaloc, NULL);
#else
  gai_gatscat(SCATTER,g_a,v,subscript,nv,&GAbytes.scatot,&GAbytes.scaloc, NULL);
#endif

}